

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

const_iterator * __thiscall
Catch::TextFlow::Column::const_iterator::operator++(const_iterator *this)

{
  Column *pCVar1;
  pointer pcVar2;
  size_type sVar3;
  byte *pbVar4;
  
  (this->m_lineStart).m_string = (this->m_lineEnd).m_string;
  (this->m_lineStart).m_it._M_current = (this->m_lineEnd).m_it._M_current;
  pCVar1 = this->m_column;
  pcVar2 = (pCVar1->m_string).m_string._M_dataplus._M_p;
  sVar3 = (pCVar1->m_string).m_string._M_string_length;
  pbVar4 = (byte *)(this->m_lineStart).m_it._M_current;
  if ((pbVar4 == (byte *)(pcVar2 + sVar3)) || (*pbVar4 != 10)) {
    while ((pbVar4 != (byte *)(pcVar2 + sVar3) &&
           (((ulong)*pbVar4 < 0x21 && ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))))) {
      AnsiSkippingString::const_iterator::advance(&this->m_lineStart);
      pcVar2 = (pCVar1->m_string).m_string._M_dataplus._M_p;
      sVar3 = (pCVar1->m_string).m_string._M_string_length;
      pbVar4 = (byte *)(this->m_lineStart).m_it._M_current;
    }
  }
  else {
    AnsiSkippingString::const_iterator::operator++(&this->m_lineStart,0);
    pcVar2 = (pCVar1->m_string).m_string._M_dataplus._M_p;
    sVar3 = (pCVar1->m_string).m_string._M_string_length;
    pbVar4 = (byte *)(this->m_lineStart).m_it._M_current;
  }
  if (pbVar4 != (byte *)(pcVar2 + sVar3)) {
    calcLength(this);
  }
  return this;
}

Assistant:

Column::const_iterator& Column::const_iterator::operator++() {
            m_lineStart = m_lineEnd;
            AnsiSkippingString const& current_line = m_column.m_string;
            if ( m_lineStart != current_line.end() && *m_lineStart == '\n' ) {
                m_lineStart++;
            } else {
                while ( m_lineStart != current_line.end() &&
                        isWhitespace( *m_lineStart ) ) {
                    ++m_lineStart;
                }
            }

            if ( m_lineStart != current_line.end() ) { calcLength(); }
            return *this;
        }